

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_mov_vec_mips64el(TCGContext_conflict6 *tcg_ctx,TCGv_vec r,TCGv_vec a)

{
  ushort uVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  
  if (r != a) {
    uVar1 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
    pTVar2 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_mov_vec);
    pTVar2->field_0x1 = (byte)((uint)uVar1 * 0x100 + 0xe00 >> 8) & 0xf;
    pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
    pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  }
  return;
}

Assistant:

void tcg_gen_mov_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_vec a)
{
    if (r != a) {
        vec_gen_op2(tcg_ctx, INDEX_op_mov_vec, 0, r, a);
    }
}